

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O1

void print_socket_error(void)

{
  int *piVar1;
  char *__s;
  size_t sVar2;
  
  piVar1 = __errno_location();
  __s = strerror(*piVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a138);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void print_socket_error()
{
	using namespace std;

#ifdef _WIN32
	LPSTR msg = nullptr;
	FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM,
	              0, WSAGetLastError(), 0, (LPSTR)&msg, 0, 0);
	cout << msg << endl;
	LocalFree(msg);
#else
	cout << strerror(errno) << endl;
#endif
}